

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<std::pair<TPZCompMesh_*,_long>_>::Resize
          (TPZVec<std::pair<TPZCompMesh_*,_long>_> *this,int64_t newsize)

{
  pair<TPZCompMesh_*,_long> *ppVar1;
  ostream *poVar2;
  pair<TPZCompMesh_*,_long> *__s;
  long lVar3;
  long lVar4;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar4 = this->fNElements;
  if (lVar4 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      if (this->fStore != (pair<TPZCompMesh_*,_long> *)0x0) {
        operator_delete__(this->fStore);
      }
      this->fStore = (pair<TPZCompMesh_*,_long> *)0x0;
    }
    else {
      __s = (pair<TPZCompMesh_*,_long> *)
            operator_new__(-(ulong)((ulong)newsize >> 0x3c != 0) | newsize << 4);
      memset(__s,0,newsize << 4);
      if (newsize <= lVar4) {
        lVar4 = newsize;
      }
      if (0 < lVar4) {
        ppVar1 = this->fStore;
        lVar3 = 8;
        do {
          *(undefined8 *)((long)__s + lVar3 + -8) = *(undefined8 *)((long)ppVar1 + lVar3 + -8);
          *(undefined8 *)((long)&__s->first + lVar3) = *(undefined8 *)((long)&ppVar1->first + lVar3)
          ;
          lVar3 = lVar3 + 0x10;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      if (this->fStore != (pair<TPZCompMesh_*,_long> *)0x0) {
        operator_delete__(this->fStore);
      }
      this->fStore = __s;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}